

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall mpt::reference<mpt::layout::graph::world>::type::type(type *this,uintptr_t initial)

{
  uintptr_t initial_local;
  type *this_local;
  
  mpt::layout::graph::world::world(&this->super_world,0);
  *(undefined ***)this = &PTR_convert_00109cd0;
  *(undefined ***)&this->field_0x8 = &PTR_property_00109d20;
  refcount::refcount(&this->_ref,initial);
  return;
}

Assistant:

type(uintptr_t initial = 1) : _ref(initial)
		{ }